

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void last_valueFinalizeFunc(sqlite3_context *pCtx)

{
  long *plVar1;
  LastValueCtx *p;
  sqlite3_context *pCtx_local;
  
  plVar1 = (long *)sqlite3_aggregate_context(pCtx,0x10);
  if ((plVar1 != (long *)0x0) && (*plVar1 != 0)) {
    sqlite3_result_value(pCtx,(sqlite3_value *)*plVar1);
    sqlite3_value_free((sqlite3_value *)*plVar1);
    *plVar1 = 0;
  }
  return;
}

Assistant:

static void last_valueFinalizeFunc(sqlite3_context *pCtx){
  struct LastValueCtx *p;
  p = (struct LastValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p && p->pVal ){
    sqlite3_result_value(pCtx, p->pVal);
    sqlite3_value_free(p->pVal);
    p->pVal = 0;
  }
}